

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmio.c
# Opt level: O0

int mm_read_mtx_crd(char *fname,int *M,int *N,int *nz,int **I,int **J,double **val,
                   MM_typecode *matcode)

{
  int iVar1;
  int *piVar2;
  double *pdVar3;
  FILE *local_50;
  FILE *f;
  int ret_code;
  int **J_local;
  int **I_local;
  int *nz_local;
  int *N_local;
  int *M_local;
  char *fname_local;
  
  iVar1 = strcmp(fname,"stdin");
  if (iVar1 == 0) {
    local_50 = _stdin;
  }
  else {
    local_50 = fopen(fname,"r");
    if (local_50 == (FILE *)0x0) {
      return 0xb;
    }
  }
  iVar1 = mm_read_banner((FILE *)local_50,matcode);
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = mm_is_valid(*matcode);
  if (((iVar1 == 0) || ((*matcode)[1] != 'C')) || ((*matcode)[0] != 'M')) {
    return 0xf;
  }
  iVar1 = mm_read_mtx_crd_size((FILE *)local_50,M,N,nz);
  if (iVar1 != 0) {
    return iVar1;
  }
  piVar2 = (int *)malloc((long)*nz << 2);
  *I = piVar2;
  piVar2 = (int *)malloc((long)*nz << 2);
  *J = piVar2;
  *val = (double *)0x0;
  if ((*matcode)[2] == 'C') {
    pdVar3 = (double *)malloc((long)(*nz << 1) << 3);
    *val = pdVar3;
    iVar1 = mm_read_mtx_crd_data((FILE *)local_50,*M,*N,*nz,*I,*J,*val,*matcode);
  }
  else if ((*matcode)[2] == 'R') {
    pdVar3 = (double *)malloc((long)*nz << 3);
    *val = pdVar3;
    iVar1 = mm_read_mtx_crd_data((FILE *)local_50,*M,*N,*nz,*I,*J,*val,*matcode);
  }
  else {
    if ((*matcode)[2] != 'P') goto LAB_0010909b;
    iVar1 = mm_read_mtx_crd_data((FILE *)local_50,*M,*N,*nz,*I,*J,*val,*matcode);
  }
  if (iVar1 != 0) {
    return iVar1;
  }
LAB_0010909b:
  if (local_50 != _stdin) {
    fclose(local_50);
  }
  return 0;
}

Assistant:

int mm_read_mtx_crd(char *fname, int *M, int *N, int *nz, int **I, int **J,
                    double **val, MM_typecode *matcode) {
    int ret_code;
    FILE *f;

    if (strcmp(fname, "stdin") == 0) f = stdin;
    else if ((f = fopen(fname, "r")) == NULL)
        return MM_COULD_NOT_READ_FILE;


    if ((ret_code = mm_read_banner(f, matcode)) != 0)
        return ret_code;

    if (!(mm_is_valid(*matcode) && mm_is_sparse(*matcode) &&
          mm_is_matrix(*matcode)))
        return MM_UNSUPPORTED_TYPE;

    if ((ret_code = mm_read_mtx_crd_size(f, M, N, nz)) != 0)
        return ret_code;


    *I = (int *) malloc(*nz * sizeof(int));
    *J = (int *) malloc(*nz * sizeof(int));
    *val = NULL;

    if (mm_is_complex(*matcode)) {
        *val = (double *) malloc(*nz * 2 * sizeof(double));
        ret_code = mm_read_mtx_crd_data(f, *M, *N, *nz, *I, *J, *val,
                                        *matcode);
        if (ret_code != 0) return ret_code;
    } else if (mm_is_real(*matcode)) {
        *val = (double *) malloc(*nz * sizeof(double));
        ret_code = mm_read_mtx_crd_data(f, *M, *N, *nz, *I, *J, *val,
                                        *matcode);
        if (ret_code != 0) return ret_code;
    } else if (mm_is_pattern(*matcode)) {
        ret_code = mm_read_mtx_crd_data(f, *M, *N, *nz, *I, *J, *val,
                                        *matcode);
        if (ret_code != 0) return ret_code;
    }

    if (f != stdin) fclose(f);
    return 0;
}